

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

obj * bp_to_obj(bill_x *bp)

{
  obj *poStack_18;
  uint id;
  obj *obj;
  bill_x *bp_local;
  
  if (bp->useup == '\0') {
    poStack_18 = find_oid(level,bp->bo_id);
  }
  else {
    poStack_18 = o_on(bp->bo_id,level->billobjs);
  }
  return poStack_18;
}

Assistant:

static struct obj *bp_to_obj(struct bill_x *bp)
{
	struct obj *obj;
	unsigned int id = bp->bo_id;

	if (bp->useup)
		obj = o_on(id, level->billobjs);
	else
		obj = find_oid(level, id);
	return obj;
}